

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocTestReporter.cpp
# Opt level: O3

bool __thiscall
ApprovalTests::DocTestReporter::report(DocTestReporter *this,string *received,string *approved)

{
  code *pcVar1;
  char extraout_AL;
  undefined1 uVar2;
  double __x;
  string approvedText;
  string receivedText;
  ResultBuilder DOCTEST_RB;
  ExpressionDecomposer local_114;
  Result local_110;
  string local_f0;
  string local_d0;
  string *local_b0;
  Enum local_a8;
  ResultBuilder local_a0;
  
  FileUtils::readFileThrowIfMissing(&local_d0,received);
  FileUtils::readFileThrowIfMissing(&local_f0,approved);
  doctest::String::String((String *)&local_110,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_a0,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/examples/out_of_source/DocTestReporter.cpp"
             ,0xc,"receivedText == approvedText","",(String *)&local_110);
  doctest::String::~String((String *)&local_110);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_114,DT_CHECK);
  local_a8 = local_114.m_at;
  local_b0 = &local_d0;
  doctest::detail::Expression_lhs<std::__cxx11::string&>::operator==
            (&local_110,(Expression_lhs<std::__cxx11::string&> *)&local_b0,&local_f0);
  doctest::detail::ResultBuilder::setResult(&local_a0,&local_110);
  doctest::String::~String(&local_110.m_decomp);
  doctest::detail::ResultBuilder::log(&local_a0,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    uVar2 = (*pcVar1)();
    return (bool)uVar2;
  }
  doctest::detail::ResultBuilder::react(&local_a0);
  doctest::String::~String((String *)&local_a0.super_AssertData.m_exception_string);
  doctest::String::~String(&local_a0.super_AssertData.m_decomp);
  doctest::String::~String(&local_a0.super_AssertData.m_exception);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool DocTestReporter::report(std::string received, std::string approved) const
    {
        auto receivedText = FileUtils::readFileThrowIfMissing(received);
        auto approvedText = FileUtils::readFileThrowIfMissing(approved);
        CHECK(receivedText == approvedText);
        return true;
    }